

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

_Bool VectorInsideTriangle2D(Vector v,Vector v1,Vector v2,Vector v3)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  bool bVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  undefined8 in_stack_00000008;
  
  lVar2 = (longdouble)CONCAT28(v1.x._0_2_,v.z._8_8_);
  lVar4 = (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_);
  lVar3 = (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_);
  lVar8 = lVar3 * (longdouble)v3._8_10_ +
          lVar2 * (longdouble)v2._8_10_ + (longdouble)v1._8_10_ * lVar4;
  lVar7 = lVar2 * (longdouble)v3._8_10_ +
          lVar3 * (longdouble)v1._8_10_ + (longdouble)v2._8_10_ * lVar4;
  lVar1 = (longdouble)CONCAT28(v.x._0_2_,in_stack_00000008);
  lVar6 = (longdouble)1;
  if (lVar8 <= lVar7 || lVar7 != lVar8) {
    lVar6 = -(longdouble)1;
  }
  if ((((longdouble)v1._8_10_ * (lVar4 - lVar1) + lVar1 * (longdouble)v3._8_10_ +
        -lVar4 * (longdouble)v._8_10_ + lVar2 * ((longdouble)v._8_10_ - (longdouble)v3._8_10_)) *
       lVar6 <= (longdouble)0) ||
     ((longdouble)0 <=
      (lVar2 * ((longdouble)v._8_10_ - (longdouble)v2._8_10_) +
      (((longdouble)v1._8_10_ * (lVar3 - lVar1) + lVar1 * (longdouble)v2._8_10_) -
      lVar3 * (longdouble)v._8_10_)) * lVar6)) {
    bVar5 = false;
  }
  else {
    bVar5 = (((longdouble)v._8_10_ - (longdouble)v3._8_10_) * lVar3 +
            -lVar4 * (longdouble)v._8_10_ +
            (longdouble)v2._8_10_ * (lVar4 - lVar1) + lVar1 * (longdouble)v3._8_10_) * lVar6 <
            (longdouble)0;
  }
  return bVar5;
}

Assistant:

bool VectorInsideTriangle2D(const Vector v, const Vector v1, const Vector v2, const Vector v3) {
  int8_t sign = v1.x * v2.y + v1.y * v3.x + v2.x * v3.y < v1.y * v2.x + v2.y * v3.x + v1.x * v3.y ? -1 : 1;
  Real a = (v1.y * (v3.x - v.x) + v3.y * v.x - v3.x * v.y + v1.x * (-v3.y + v.y));
  Real b = (v1.y * (v2.x - v.x) + v2.y * v.x - v2.x * v.y + v1.x * (-v2.y + v.y));
  Real c = (v2.y * (v3.x - v.x) + v3.y * v.x - v3.x * v.y + v2.x * (-v3.y + v.y));
  return a * sign > 0 && b * sign < 0 && c * sign < 0;
}